

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

_Bool borg_shoot_scoot_safe(wchar_t emergency,wchar_t turns,wchar_t b_p)

{
  ushort uVar1;
  borg_grid *pbVar2;
  loc_conflict grid;
  loc grid1;
  bool bVar3;
  monster_race *pmVar4;
  int iVar5;
  int iVar6;
  _Bool _Var7;
  wchar_t wVar8;
  uint32_t uVar9;
  borg_kill *pbVar10;
  loc grid2;
  char *pcVar11;
  monster_race *r_ptr;
  borg_kill *kill;
  borg_grid *ag;
  _Bool adjacent_monster;
  wchar_t min;
  wchar_t dis;
  wchar_t u;
  wchar_t p;
  wchar_t y;
  wchar_t x;
  wchar_t d;
  wchar_t i;
  wchar_t k;
  wchar_t n;
  wchar_t b_p_local;
  wchar_t turns_local;
  wchar_t emergency_local;
  
  bVar3 = false;
  if ((borg.trait[0x23] < 8) || (borg.trait[0x69] != 0)) {
    if (borg.trait[0xd2] == 0) {
      turns_local._3_1_ = false;
    }
    else if (borg.trait[0x1a] == 0) {
      turns_local._3_1_ = false;
    }
    else {
      grid.y = borg.c.y;
      grid.x = borg.c.x;
      _Var7 = square_isvault((chunk *)cave,grid);
      if (_Var7) {
        turns_local._3_1_ = false;
      }
      else {
        _Var7 = borg_primarily_caster();
        if (_Var7) {
          if ((0x2c < borg.trait[0x23]) && (borg.trait[0x1e] < 0xf)) {
            return false;
          }
          if ((borg.trait[0x23] < 0x2d) && (borg.trait[0x1e] < 5)) {
            return false;
          }
        }
        else if ((borg.trait[0x9b] < 5) || (0x2c < borg.trait[0x23])) {
          return false;
        }
        if (((borg_morgoth_position & 1U) == 0) && ((borg_as_position & 1U) == 0)) {
          for (x = L'\0'; pmVar4 = r_info, x < L'\b'; x = x + L'\x01') {
            p = borg.c.x + ddx_ddd[x];
            u = borg.c.y + ddy_ddd[x];
            pbVar10 = borg_kills + borg_grids[u][p].kill;
            uVar1 = pbVar10->r_idx;
            if (((((borg_grids[u][p].kill != '\0') && ((pbVar10->awake & 1U) != 0)) &&
                 (_Var7 = flag_has_dbg(r_info[uVar1].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"),
                 !_Var7)) &&
                ((_Var7 = flag_has_dbg(pmVar4[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL"),
                 !_Var7 && (_Var7 = flag_has_dbg(pmVar4[uVar1].flags,0xb,0x2f,"r_ptr->flags",
                                                 "RF_KILL_WALL"), !_Var7)))) &&
               (borg.trait[0x23] <= (int)pbVar10->power)) {
              _Var7 = borg_spell_okay(MAGIC_MISSILE);
              if (_Var7) {
                bVar3 = true;
              }
              else {
                _Var7 = borg_spell_okay(ORB_OF_DRAINING);
                if (_Var7) {
                  bVar3 = true;
                }
                else {
                  _Var7 = borg_spell_okay(NETHER_BOLT);
                  if (_Var7) {
                    bVar3 = true;
                  }
                  else {
                    wVar8 = borg_danger_one_kill
                                      ((pbVar10->pos).y,(pbVar10->pos).x,L'\x01',x,true,false);
                    if (((avoidance * 3) / 10 < wVar8) ||
                       ((((pmVar4[uVar1].friends != (monster_friends *)0x0 ||
                          (pmVar4[uVar1].friends_base != (monster_friends_base *)0x0)) &&
                         (borg.trait[0x23] + -5 <= (int)pbVar10->level)) ||
                        ((((pbVar10->ranged_attack != '\0' ||
                           (_Var7 = flag_has_dbg(pmVar4[uVar1].flags,0xb,1,"r_ptr->flags",
                                                 "RF_UNIQUE"), _Var7)) ||
                          (_Var7 = flag_has_dbg(pmVar4[uVar1].flags,0xb,0x11,"r_ptr->flags",
                                                "RF_MULTIPLY"), _Var7)) || (borg.trait[0x23] < 6))))
                       )) {
                      bVar3 = true;
                    }
                  }
                }
              }
            }
          }
          if (bVar3) {
            i = L'\0';
            for (d = L'\0'; d < L'd'; d = d + L'\x01') {
              for (x = L'\0'; x < L'd'; x = x + L'\x01') {
                do {
                  do {
                    iVar6 = borg.c.y;
                    uVar9 = Rand_div(0x15);
                    iVar5 = borg.c.x;
                    u = iVar6 + uVar9 + L'\xfffffff6';
                    uVar9 = Rand_div(0x15);
                    p = iVar5 + uVar9 + L'\xfffffff6';
                    grid2 = loc(p,u);
                    grid1.y = borg.c.y;
                    grid1.x = borg.c.x;
                    wVar8 = distance(grid1,grid2);
                  } while (wVar8 < L'\x05');
                } while (L'\n' < wVar8);
                if ((((L'\0' < u) && (u < L'@')) &&
                    ((L'\0' < p && ((p < L'Ä' && (pbVar2 = borg_grids[u], pbVar2[p].feat != '\0')))
                     ))) && ((_Var7 = borg_cave_floor_bold(u,p), _Var7 && (pbVar2[p].kill == '\0')))
                   ) break;
              }
              if (x < L'd') {
                wVar8 = borg_danger(u,p,turns,true,false);
                if (b_p < wVar8) {
                  i = i + L'\x01';
                }
                else {
                  for (min = L'\0'; min < L'\b'; min = min + L'\x01') {
                    if ((borg_grids[u + ddy_ddd[min]][p + ddx_ddd[min]].kill != '\0') &&
                       ((borg_kills[borg_grids[u + ddy_ddd[min]][p + ddx_ddd[min]].kill].awake & 1U)
                        != 0)) {
                      i = i + L'\x01';
                    }
                  }
                }
              }
              else {
                i = i + L'\x01';
              }
            }
            if (emergency < i) {
              pcVar11 = format("# No Shoot\'N\'Scoot. scary squares: %d/100",(ulong)(uint)i);
              borg_note(pcVar11);
              turns_local._3_1_ = false;
            }
            else {
              pcVar11 = format("# Safe to Shoot\'N\'Scoot. scary squares: %d/100",(ulong)(uint)i);
              borg_note(pcVar11);
              turns_local._3_1_ = true;
            }
          }
          else {
            turns_local._3_1_ = false;
          }
        }
        else {
          turns_local._3_1_ = false;
        }
      }
    }
  }
  else {
    turns_local._3_1_ = false;
  }
  return turns_local._3_1_;
}

Assistant:

bool borg_shoot_scoot_safe(int emergency, int turns, int b_p)
{
    int n, k, i, d, x, y, p, u;

    int dis               = 10;

    int min               = dis / 2;

    bool adjacent_monster = false;

    borg_grid           *ag;
    borg_kill           *kill;
    struct monster_race *r_ptr;

    /* no need if high level in town */
    if (borg.trait[BI_CLEVEL] >= 8 && borg.trait[BI_CDEPTH] == 0)
        return false;

    /* must have the ability */
    if (!borg.trait[BI_APHASE])
        return false;

    /* Not if No Light */
    if (!borg.trait[BI_LIGHT])
        return false;

    /* Cheat the floor grid */
    /* Not if in a vault since it throws us out of the vault */
    if (square_isvault(cave, borg.c))
        return false;

    /*** Need Missiles or cheap spells ***/

    /* classes that are mainly spellcaster */
    if (borg_primarily_caster()) {
        /* Low mana */
        if (borg.trait[BI_CLEVEL] >= 45 && borg.trait[BI_CURSP] < 15)
            return false;

        /* Low mana, low level, generally OK */
        if (borg.trait[BI_CLEVEL] < 45 && borg.trait[BI_CURSP] < 5)
            return false;
    } else /* Other classes need some missiles */
    {
        if (borg.trait[BI_AMISSILES] < 5 || borg.trait[BI_CLEVEL] >= 45)
            return false;
    }

    /* Not if I am in a safe spot for killing special monsters */
    if (borg_morgoth_position || borg_as_position)
        return false;

    /* scan the adjacent grids for an awake monster */
    for (i = 0; i < 8; i++) {
        /* Grid in that direction */
        x = borg.c.x + ddx_ddd[i];
        y = borg.c.y + ddy_ddd[i];

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Obtain the monster */
        kill  = &borg_kills[ag->kill];
        r_ptr = &r_info[kill->r_idx];

        /* If a qualifying monster is adjacent to me. */
        if ((ag->kill && kill->awake) && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))
            && !(rf_has(r_ptr->flags, RF_PASS_WALL))
            && !(rf_has(r_ptr->flags, RF_KILL_WALL))
            && (kill->power >= borg.trait[BI_CLEVEL])) {
            /* Spell casters shoot at everything */
            if (borg_spell_okay(MAGIC_MISSILE)) {
                adjacent_monster = true;
            } else if (borg_spell_okay(ORB_OF_DRAINING)) {
                adjacent_monster = true;
            } else if (borg_spell_okay(NETHER_BOLT)) {
                adjacent_monster = true;
            }

            /* All other borgs need to make sure he would shoot.
             * In an effort to conserve missiles, the borg will
             * not shoot at certain types of monsters.  That list
             * is defined in borg_launch_damage_one().
             *
             * We need this aforementioned list to match the one
             * following.  Otherwise Rogues and Warriors will
             * burn up Phases as he scoots away but never fire
             * the missiles.  That totally defeats the purpose
             * of this routine.
             *
             * The following criteria are exactly the same as the
             * list in borg_launch_damage_one()
             */
            else if ((borg_danger_one_kill(
                          kill->pos.y, kill->pos.x, 1, i, true, false)
                         > avoidance * 3 / 10)
                     || ((r_ptr->friends
                             || r_ptr->friends_base) /* monster has friends*/
                         && kill->level
                                >= borg.trait[BI_CLEVEL] - 5 /* close levels */)
                     || (kill->ranged_attack /* monster has a ranged attack */)
                     || (rf_has(r_ptr->flags, RF_UNIQUE))
                     || (rf_has(r_ptr->flags, RF_MULTIPLY))
                     || (borg.trait[BI_CLEVEL] <= 5 /* still very weak */)) {
                adjacent_monster = true;
            }
        }
    }

    /* if No Adjacent_monster no need for it */
    if (adjacent_monster == false)
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 2))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 2))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids */
            if (ag->feat == FEAT_NONE)
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Stop looking.  Really, the game would keep
             * looking for a grid.  The borg could check
             * all the known grids but I don't think that
             * is not a good idea, especially if the area is
             * not fully explored.
             */
            break;
        }

        /* No location */
        /* In the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but we define it as dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine danger of that grid */
        p = borg_danger(y, x, turns, true, false);

        /* if more scary than my current one, do not allow jumps at all */
        if (p > b_p) {
            n++;
            continue;
        }

        /* Should not land next to a monster either.
         * Scan the adjacent grids for a monster.
         * Reuse the adjacent_monster variable.
         */
        for (u = 0; u < 8; u++) {
            /* Access the grid */
            ag = &borg_grids[y + ddy_ddd[u]][x + ddx_ddd[u]];

            /* Obtain the monster */
            kill = &borg_kills[ag->kill];

            /* If monster adjacent to that grid...
             */
            if (ag->kill && kill->awake)
                n++;
        }
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Shoot'N'Scoot. scary squares: %d/100", n));
        return false;
    } else
        borg_note(format("# Safe to Shoot'N'Scoot. scary squares: %d/100", n));

    /* Okay */
    return true;
}